

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O0

void __thiscall efsw::FileWatcherGeneric::removeWatch(FileWatcherGeneric *this,WatchID watchid)

{
  bool bVar1;
  reference ppWVar2;
  const_iterator local_38;
  WatcherGeneric *local_30;
  WatcherGeneric *watch;
  _Self local_20;
  iterator it;
  WatchID watchid_local;
  FileWatcherGeneric *this_local;
  
  it._M_node = (_List_node_base *)watchid;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::begin
                 (&this->mWatches);
  while( true ) {
    watch = (WatcherGeneric *)
            std::__cxx11::list<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::end
                      (&this->mWatches);
    bVar1 = std::operator!=(&local_20,(_Self *)&watch);
    if (!bVar1) {
      return;
    }
    ppWVar2 = std::_List_iterator<efsw::WatcherGeneric_*>::operator*(&local_20);
    if ((_List_node_base *)((*ppWVar2)->super_Watcher).ID == it._M_node) break;
    std::_List_iterator<efsw::WatcherGeneric_*>::operator++(&local_20,0);
  }
  ppWVar2 = std::_List_iterator<efsw::WatcherGeneric_*>::operator*(&local_20);
  local_30 = *ppWVar2;
  Mutex::lock(&this->mWatchesLock);
  std::_List_const_iterator<efsw::WatcherGeneric_*>::_List_const_iterator(&local_38,&local_20);
  std::__cxx11::list<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::erase
            (&this->mWatches,local_38);
  if (local_30 != (WatcherGeneric *)0x0) {
    if (local_30 != (WatcherGeneric *)0x0) {
      (*(local_30->super_Watcher)._vptr_Watcher[1])();
    }
    local_30 = (WatcherGeneric *)0x0;
  }
  Mutex::unlock(&this->mWatchesLock);
  return;
}

Assistant:

void FileWatcherGeneric::removeWatch(WatchID watchid)
{
	WatchList::iterator it = mWatches.begin();

	for ( ; it != mWatches.end(); it++ )
	{
		if ( (*it)->ID == watchid )
		{
			WatcherGeneric * watch = (*it);

			mWatchesLock.lock();

			mWatches.erase( it );

			efSAFE_DELETE( watch ) ;

			mWatchesLock.unlock();

			return;
		}
	}
}